

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  UnitTestImpl *this_00;
  allocator local_39;
  string local_38;
  TestInfo *local_18;
  TestInfo *info;
  DeathTest *this_local;
  
  this->_vptr_DeathTest = (_func_int **)&PTR__DeathTest_001a89a0;
  info = (TestInfo *)this;
  this_00 = GetUnitTestImpl();
  local_18 = UnitTestImpl::current_test_info(this_00);
  if (local_18 == (TestInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"Cannot run a death test outside of a TEST or TEST_F construct",
               &local_39);
    DeathTestAbort(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == NULL) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}